

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int expansion_sum_zeroelim1(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  uVar3 = 0;
  uVar5 = (ulong)(uint)elen;
  dVar8 = *f;
  if (elen < 1) {
    uVar5 = uVar3;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    dVar9 = dVar8 + e[uVar3];
    h[uVar3] = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (e[uVar3] - (dVar9 - dVar8));
    dVar8 = dVar9;
  }
  h[uVar5] = dVar8;
  pdVar4 = h + 1;
  uVar3 = uVar5;
  for (lVar6 = 1; lVar6 < flen; lVar6 = lVar6 + 1) {
    dVar8 = f[lVar6];
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      dVar9 = dVar8 + pdVar4[uVar7];
      pdVar4[uVar7] = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (pdVar4[uVar7] - (dVar9 - dVar8));
      dVar8 = dVar9;
    }
    h[uVar3 + 1] = dVar8;
    uVar3 = uVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  iVar1 = -1;
  for (uVar5 = 0; uVar5 <= (uVar3 & 0xffffffff); uVar5 = uVar5 + 1) {
    dVar8 = h[uVar5];
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      lVar6 = (long)iVar1;
      iVar1 = iVar1 + 1;
      h[lVar6 + 1] = dVar8;
    }
  }
  iVar2 = 1;
  if (iVar1 != -1) {
    iVar2 = iVar1 + 1;
  }
  return iVar2;
}

Assistant:

int expansion_sum_zeroelim1(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int index, findex, hindex, hlast;
  REAL hnow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = f[0];
  for (hindex = 0; hindex < elen; hindex++) {
    hnow = e[hindex];
    Two_Sum(Q, hnow, Qnew, h[hindex]);
    Q = Qnew;
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    Q = f[findex];
    for (hindex = findex; hindex <= hlast; hindex++) {
      hnow = h[hindex];
      Two_Sum(Q, hnow, Qnew, h[hindex]);
      Q = Qnew;
    }
    h[++hlast] = Q;
  }
  hindex = -1;
  for (index = 0; index <= hlast; index++) {
    hnow = h[index];
    if (hnow != 0.0) {
      h[++hindex] = hnow;
    }
  }
  if (hindex == -1) {
    return 1;
  } else {
    return hindex + 1;
  }
}